

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O2

cio_error write_response(cio_http_client *client,cio_http_status_code status_code,
                        cio_write_buffer *wbh_body,cio_response_written_cb_t written_cb)

{
  anon_union_16_2_70f96463_for_data *paVar1;
  size_t *psVar2;
  void *pvVar3;
  cio_write_buffer *pcVar4;
  cio_write_buffer *pcVar5;
  cio_write_buffer *pcVar6;
  cio_write_buffer *pcVar7;
  int iVar8;
  cio_error cVar9;
  size_t sVar10;
  size_t sVar11;
  char *pcVar12;
  
  if ((client->http_private).response_written == false) {
    client->response_written_cb = written_cb;
    (client->http_private).response_fired = true;
    if (wbh_body == (cio_write_buffer *)0x0) {
      sVar11 = 0;
    }
    else {
      sVar11 = (wbh_body->data).element.length;
    }
    pcVar12 = (client->http_private).content_length_buffer;
    iVar8 = snprintf(pcVar12,0x1d,"Content-Length: %zu\r\n",sVar11);
    (client->http_private).wb_http_content_length.data.head.q_len = (size_t)pcVar12;
    *(long *)((long)&(client->http_private).wb_http_content_length.data + 8) = (long)iVar8;
    pcVar7 = &client->response_wbh;
    cio_write_buffer_queue_tail(pcVar7,&(client->http_private).wb_http_content_length);
    if (((status_code == CIO_HTTP_STATUS_BAD_REQUEST) ||
        (status_code == CIO_HTTP_STATUS_INTERNAL_SERVER_ERROR)) ||
       (status_code == CIO_HTTP_STATUS_TIMEOUT)) {
      (client->http_private).close_immediately = true;
    }
    pvVar3 = (client->parser).data;
    cVar9 = cio_timer_expires_from_now
                      (&(client->http_private).response_timer,*(uint64_t *)((long)pvVar3 + 0xa0),
                       client_timeout_handler,client);
    if (cVar9 == CIO_SUCCESS) {
      if (status_code == CIO_HTTP_STATUS_SWITCHING_PROTOCOLS) {
        pcVar12 = "HTTP/1.1 101 Switching Protocols\r\nServer: cio http/0.0.1-1742+59956b85\r\n";
      }
      else if (status_code == CIO_HTTP_STATUS_TIMEOUT) {
        pcVar12 = "HTTP/1.1 408 Request Timeout\r\nServer: cio http/0.0.1-1742+59956b85\r\n";
      }
      else if (status_code == CIO_HTTP_STATUS_BAD_REQUEST) {
        pcVar12 = "HTTP/1.1 400 Bad Request\r\nServer: cio http/0.0.1-1742+59956b85\r\n";
      }
      else if (status_code == CIO_HTTP_STATUS_NOT_FOUND) {
        pcVar12 = "HTTP/1.1 404 Not Found\r\nServer: cio http/0.0.1-1742+59956b85\r\n";
      }
      else if (status_code == CIO_HTTP_STATUS_OK) {
        pcVar12 = "HTTP/1.1 200 OK\r\nServer: cio http/0.0.1-1742+59956b85\r\n";
      }
      else {
        pcVar12 = "HTTP/1.1 500 Internal Server Error\r\nServer: cio http/0.0.1-1742+59956b85\r\n";
      }
      sVar10 = strlen(pcVar12);
      (client->http_private).wb_http_response_statusline.data.head.q_len = (size_t)pcVar12;
      (client->http_private).wb_http_response_statusline.data.element.length = sVar10;
      cio_write_buffer_insert
                (pcVar7,&(client->http_private).wb_http_response_statusline,pcVar7,
                 (client->response_wbh).next);
      if (status_code == CIO_HTTP_STATUS_SWITCHING_PROTOCOLS) {
        (client->http_private).wb_http_connection_header.data.head.q_len =
             (size_t)"Connection: Upgrade\r\n";
        (client->http_private).wb_http_connection_header.data.element.length = 0x15;
      }
      else if (((client->http_private).should_keepalive == true) &&
              ((client->http_private).close_immediately == false)) {
        (client->http_private).wb_http_connection_header.data.head.q_len =
             (size_t)"Connection: keep-alive\r\n";
        (client->http_private).wb_http_connection_header.data.element.length = 0x18;
        pcVar12 = (char *)((long)(client->parser).data + 0x128);
        sVar10 = strlen(pcVar12);
        (client->http_private).wb_http_keepalive_header.data.head.q_len = (size_t)pcVar12;
        (client->http_private).wb_http_keepalive_header.data.element.length = sVar10;
        cio_write_buffer_queue_tail(pcVar7,&(client->http_private).wb_http_keepalive_header);
      }
      else {
        (client->http_private).wb_http_connection_header.data.head.q_len =
             (size_t)"Connection: close\r\n";
        (client->http_private).wb_http_connection_header.data.element.length = 0x13;
      }
      cio_write_buffer_queue_tail(pcVar7,&(client->http_private).wb_http_connection_header);
      (client->http_private).wb_http_response_header_end.data.head.q_len = (size_t)"\r\n";
      (client->http_private).wb_http_response_header_end.data.element.length = 2;
      cio_write_buffer_queue_tail(pcVar7,&(client->http_private).wb_http_response_header_end);
      if ((wbh_body != (cio_write_buffer *)0x0) && (pcVar4 = wbh_body->next, pcVar4 != wbh_body)) {
        pcVar5 = wbh_body->prev;
        pcVar6 = (client->response_wbh).prev;
        pcVar6->next = pcVar4;
        pcVar4->prev = pcVar6;
        pcVar5->next = pcVar7;
        (client->response_wbh).prev = pcVar5;
        paVar1 = &(client->response_wbh).data;
        (paVar1->head).q_len = (paVar1->head).q_len + (wbh_body->data).head.q_len;
        psVar2 = &(client->response_wbh).data.element.length;
        *psVar2 = *psVar2 + (wbh_body->data).element.length;
        wbh_body->prev = wbh_body;
        wbh_body->next = wbh_body;
        (wbh_body->data).head.q_len = 0;
        (wbh_body->data).element.length = 0;
      }
      (client->http_private).response_written = true;
      cVar9 = cio_buffered_stream_write(&client->buffered_stream,pcVar7,response_written,client);
      return cVar9;
    }
    paVar1 = &(client->response_wbh).data;
    (paVar1->head).q_len = (paVar1->head).q_len - 1;
    psVar2 = &(client->response_wbh).data.element.length;
    *psVar2 = *psVar2 - (client->http_private).wb_http_content_length.data.element.length;
    pcVar7 = (client->http_private).wb_http_content_length.next;
    pcVar4 = (client->http_private).wb_http_content_length.prev;
    pcVar7->prev = pcVar4;
    pcVar4->next = pcVar7;
    if (*(code **)((long)pvVar3 + 0xa8) != (code *)0x0) {
      (**(code **)((long)pvVar3 + 0xa8))(pvVar3,"Arming of response timer failed!");
    }
    mark_to_be_closed(client);
    cVar9 = CIO_SUCCESS;
  }
  else {
    cVar9 = CIO_OPERATION_NOT_PERMITTED;
  }
  return cVar9;
}

Assistant:

static enum cio_error write_response(struct cio_http_client *client, enum cio_http_status_code status_code, struct cio_write_buffer *wbh_body, cio_response_written_cb_t written_cb)
{
	if (cio_unlikely(client->http_private.response_written)) {
		return CIO_OPERATION_NOT_PERMITTED;
	}

	client->response_written_cb = written_cb;
	client->http_private.response_fired = true;
	size_t content_length = 0;
	if (wbh_body) {
		content_length = cio_write_buffer_get_total_size(wbh_body);
	}

	int written = snprintf(client->http_private.content_length_buffer, sizeof(client->http_private.content_length_buffer) - 1, "Content-Length: %zu" CIO_CRLF, content_length);
	cio_write_buffer_element_init(&client->http_private.wb_http_content_length, client->http_private.content_length_buffer, (size_t)written);
	add_response_header(client, &client->http_private.wb_http_content_length);

	if ((status_code == CIO_HTTP_STATUS_BAD_REQUEST) || (status_code == CIO_HTTP_STATUS_TIMEOUT) || (status_code == CIO_HTTP_STATUS_INTERNAL_SERVER_ERROR)) {
		client->http_private.close_immediately = true;
	}

	struct cio_http_server *server = cio_http_client_get_server(client);
	enum cio_error err = cio_timer_expires_from_now(&client->http_private.response_timer, server->response_timeout_ns, client_timeout_handler, client);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		cio_write_buffer_unlink(&client->response_wbh, &client->http_private.wb_http_content_length);
		handle_error(server, "Arming of response timer failed!");
		mark_to_be_closed(client);
		return 0;
	}

	start_response_header(client, status_code);
	end_response_header(client);
	if (wbh_body) {
		cio_write_buffer_splice(wbh_body, &client->response_wbh);
	}

	client->http_private.response_written = true;
	return flush(client, response_written);
}